

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiStackSizes::CompareWithCurrentState(ImGuiStackSizes *this)

{
  if ((GImGui->CurrentWindow->IDStack).Size != (int)this->SizeOfIDStack) {
    __assert_fail("SizeOfIDStack == window->IDStack.Size && \"PushID/PopID or TreeNode/TreePop Mismatch!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1c29,"void ImGuiStackSizes::CompareWithCurrentState()");
  }
  if ((GImGui->GroupStack).Size != (int)this->SizeOfGroupStack) {
    __assert_fail("SizeOfGroupStack == g.GroupStack.Size && \"BeginGroup/EndGroup Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1c2d,"void ImGuiStackSizes::CompareWithCurrentState()");
  }
  if ((GImGui->BeginPopupStack).Size != (int)this->SizeOfBeginPopupStack) {
    __assert_fail("SizeOfBeginPopupStack == g.BeginPopupStack.Size && \"BeginPopup/EndPopup or BeginMenu/EndMenu Mismatch!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1c2e,"void ImGuiStackSizes::CompareWithCurrentState()");
  }
  if ((GImGui->ColorStack).Size <= (int)this->SizeOfColorStack) {
    if ((int)this->SizeOfStyleVarStack < (GImGui->StyleVarStack).Size) {
      __assert_fail("SizeOfStyleVarStack >= g.StyleVarStack.Size && \"PushStyleVar/PopStyleVar Mismatch!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1c30,"void ImGuiStackSizes::CompareWithCurrentState()");
    }
    if ((GImGui->FontStack).Size <= (int)this->SizeOfFontStack) {
      if ((GImGui->FocusScopeStack).Size == (int)this->SizeOfFocusScopeStack) {
        return;
      }
      __assert_fail("SizeOfFocusScopeStack == g.FocusScopeStack.Size && \"PushFocusScope/PopFocusScope Mismatch!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1c32,"void ImGuiStackSizes::CompareWithCurrentState()");
    }
    __assert_fail("SizeOfFontStack >= g.FontStack.Size && \"PushFont/PopFont Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1c31,"void ImGuiStackSizes::CompareWithCurrentState()");
  }
  __assert_fail("SizeOfColorStack >= g.ColorStack.Size && \"PushStyleColor/PopStyleColor Mismatch!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1c2f,"void ImGuiStackSizes::CompareWithCurrentState()");
}

Assistant:

void ImGuiStackSizes::CompareWithCurrentState()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_UNUSED(window);

    // Window stacks
    // NOT checking: DC.ItemWidth, DC.TextWrapPos (per window) to allow user to conveniently push once and not pop (they are cleared on Begin)
    IM_ASSERT(SizeOfIDStack         == window->IDStack.Size     && "PushID/PopID or TreeNode/TreePop Mismatch!");

    // Global stacks
    // For color, style and font stacks there is an incentive to use Push/Begin/Pop/.../End patterns, so we relax our checks a little to allow them.
    IM_ASSERT(SizeOfGroupStack      == g.GroupStack.Size        && "BeginGroup/EndGroup Mismatch!");
    IM_ASSERT(SizeOfBeginPopupStack == g.BeginPopupStack.Size   && "BeginPopup/EndPopup or BeginMenu/EndMenu Mismatch!");
    IM_ASSERT(SizeOfColorStack      >= g.ColorStack.Size        && "PushStyleColor/PopStyleColor Mismatch!");
    IM_ASSERT(SizeOfStyleVarStack   >= g.StyleVarStack.Size     && "PushStyleVar/PopStyleVar Mismatch!");
    IM_ASSERT(SizeOfFontStack       >= g.FontStack.Size         && "PushFont/PopFont Mismatch!");
    IM_ASSERT(SizeOfFocusScopeStack == g.FocusScopeStack.Size   && "PushFocusScope/PopFocusScope Mismatch!");
}